

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  Parse *pPVar1;
  Trigger *pTVar2;
  int iVar3;
  undefined8 *in_RDX;
  long *plVar4;
  Trigger *pTVar5;
  
  if ((char)pTab == '\0') {
    pPVar1 = (Parse *)in_RDX[0xe];
    if ((pPVar1 != pParse) && (plVar4 = *(long **)&pParse->szOpAlloc, plVar4 != (long *)0x0)) {
      pTVar5 = (Trigger *)0x0;
      do {
        pTVar2 = (Trigger *)plVar4[2];
        if (((Parse *)pTVar2->pTabSchema == pPVar1) &&
           (iVar3 = sqlite3StrICmp(pTVar2->table,(char *)*in_RDX), iVar3 == 0)) {
          if (pTVar5 == (Trigger *)0x0) {
            pTVar5 = (Trigger *)in_RDX[0xd];
          }
          pTVar2->pNext = pTVar5;
          pTVar5 = pTVar2;
        }
        plVar4 = (long *)*plVar4;
      } while (plVar4 != (long *)0x0);
      if (pTVar5 != (Trigger *)0x0) {
        return pTVar5;
      }
    }
    pTVar5 = (Trigger *)in_RDX[0xd];
  }
  else {
    pTVar5 = (Trigger *)0x0;
  }
  return pTVar5;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema * const pTmpSchema = pParse->db->aDb[1].pSchema;
  Trigger *pList = 0;                  /* List of triggers to return */

  if( pParse->disableTriggers ){
    return 0;
  }

  if( pTmpSchema!=pTab->pSchema ){
    HashElem *p;
    assert( sqlite3SchemaMutexHeld(pParse->db, 0, pTmpSchema) );
    for(p=sqliteHashFirst(&pTmpSchema->trigHash); p; p=sqliteHashNext(p)){
      Trigger *pTrig = (Trigger *)sqliteHashData(p);
      if( pTrig->pTabSchema==pTab->pSchema
       && 0==sqlite3StrICmp(pTrig->table, pTab->zName) 
      ){
        pTrig->pNext = (pList ? pList : pTab->pTrigger);
        pList = pTrig;
      }
    }
  }

  return (pList ? pList : pTab->pTrigger);
}